

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O3

bool __thiscall ON_Plane::CreateFromEquation(ON_Plane *this,ON_PlaneEquation *eqn)

{
  ON_3dVector *this_00;
  ON_3dVector *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dVector local_40;
  
  dVar1 = eqn->y;
  dVar2 = eqn->z;
  dVar3 = eqn->d;
  (this->plane_equation).x = eqn->x;
  (this->plane_equation).y = dVar1;
  (this->plane_equation).z = dVar2;
  (this->plane_equation).d = dVar3;
  this_00 = &this->zaxis;
  dVar1 = (this->plane_equation).y;
  (this->zaxis).x = (this->plane_equation).x;
  (this->zaxis).y = dVar1;
  (this->zaxis).z = (this->plane_equation).z;
  dVar1 = ON_3dVector::Length(this_00);
  if (0.0 < dVar1) {
    ON_3dVector::operator*=(this_00,1.0 / dVar1);
    ::operator*(&local_40,-(1.0 / dVar1) * (this->plane_equation).d,this_00);
    ON_3dPoint::operator=(&this->origin,&local_40);
  }
  this_01 = &this->xaxis;
  ON_3dVector::PerpendicularTo(this_01,this_00);
  ON_3dVector::Unitize(this_01);
  ON_CrossProduct(&local_40,this_00,this_01);
  (this->yaxis).z = local_40.z;
  (this->yaxis).x = local_40.x;
  (this->yaxis).y = local_40.y;
  ON_3dVector::Unitize(&this->yaxis);
  return 0.0 < dVar1;
}

Assistant:

bool ON_Plane::CreateFromEquation(
  const class ON_PlaneEquation& eqn
  )
{
  bool b = false;
  
  plane_equation = eqn;

  zaxis.x = plane_equation.x;
  zaxis.y = plane_equation.y;
  zaxis.z = plane_equation.z;

  double d = zaxis.Length();
  if (d > 0.0) {
    d = 1.0 / d;
		zaxis *= d;		
    origin = (-d*plane_equation.d)*zaxis;
    b = true;
  }
  xaxis.PerpendicularTo(zaxis);
  xaxis.Unitize();
  yaxis = ON_CrossProduct(zaxis, xaxis);
  yaxis.Unitize();
  return b;
}